

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O2

MPP_RET __thiscall Mpp::control_osal(Mpp *this,MpiCmd cmd,MppParam param)

{
  undefined8 in_RAX;
  char *pcVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((int)cmd < 0x100001) {
    uVar2 = CONCAT44(uVar3,0x4cf);
    pcVar1 = "cmd > MPP_OSAL_CMD_BASE";
  }
  else {
    uVar2 = CONCAT44(uVar3,0x4d0);
    pcVar1 = "cmd < MPP_OSAL_CMD_END";
  }
  _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,pcVar1,"control_osal",uVar2);
  if ((mpp_debug._3_1_ & 0x10) == 0) {
    return MPP_NOK;
  }
  abort();
}

Assistant:

MPP_RET Mpp::control_osal(MpiCmd cmd, MppParam param)
{
    MPP_RET ret = MPP_NOK;

    mpp_assert(cmd > MPP_OSAL_CMD_BASE);
    mpp_assert(cmd < MPP_OSAL_CMD_END);

    (void)cmd;
    (void)param;
    return ret;
}